

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O2

string * __thiscall
duckdb::JoinRelationTreeNodeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,JoinRelationTreeNode *node)

{
  JoinRelationTreeNode *extraout_RDX;
  JoinRelationTreeNode *extraout_RDX_00;
  JoinRelationTreeNode *node_00;
  JoinRelationTreeNode *extraout_RDX_01;
  duckdb *pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&bStack_58);
  node_00 = extraout_RDX;
  if (*(JoinRelationSet **)this != (JoinRelationSet *)0x0) {
    JoinRelationSet::ToString_abi_cxx11_(&local_38,*(JoinRelationSet **)this);
    ::std::operator+(&bStack_58,&local_38,anon_var_dwarf_4b0ff16 + 8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_58);
    ::std::__cxx11::string::~string((string *)&local_38);
    node_00 = extraout_RDX_00;
  }
  pdVar1 = this + 0x18;
  while (pdVar1 = *(duckdb **)pdVar1, pdVar1 != (duckdb *)0x0) {
    JoinRelationTreeNodeToString_abi_cxx11_(&bStack_58,*(duckdb **)(pdVar1 + 0x10),node_00);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_58);
    node_00 = extraout_RDX_01;
  }
  return __return_storage_ptr__;
}

Assistant:

static string JoinRelationTreeNodeToString(const JoinRelationTreeNode *node) {
	string result = "";
	if (node->relation) {
		result += node->relation.get()->ToString() + "\n";
	}
	for (auto &child : node->children) {
		result += JoinRelationTreeNodeToString(child.second.get());
	}
	return result;
}